

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_values.cpp
# Opt level: O2

ON_ScaleValue *
ON_ScaleValue::CreateFromSubString
          (ON_ScaleValue *__return_storage_ptr__,ON_ParseSettings parse_settings,wchar_t *string,
          int string_count,wchar_t **string_end)

{
  wchar_t wVar1;
  ON_ParseSettings parse_settings_00;
  wchar_t *pwVar2;
  bool bVar3;
  LengthUnitSystem LVar4;
  int iVar5;
  wchar_t *string_00;
  int iVar6;
  int string_count_00;
  ulong uVar7;
  ON_ScaleValue *this;
  double dVar8;
  ScaleStringFormat local_15a;
  wchar_t *right_side_string_end;
  double local_148;
  wchar_t *left_side_string_end;
  ON_ParseSettings right_side_parse_settings;
  ON_LengthValue right_side;
  ON_LengthValue left_side;
  ON_ScaleValue scale_value;
  
  if (string_end != (wchar_t **)0x0) {
    *string_end = string;
  }
  if (string_count < -1) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_string_values.cpp"
               ,0x4b4,"","Invalid string_count parameter.");
LAB_005ca3d4:
    ON_ScaleValue(__return_storage_ptr__,&Unset);
    return __return_storage_ptr__;
  }
  if ((string_count == 0 || string == (wchar_t *)0x0) || (*string == L'\0')) goto LAB_005ca3d4;
  left_side_string_end = (wchar_t *)0x0;
  ON_LengthValue::CreateFromSubString
            (&left_side,parse_settings,string,string_count,&left_side_string_end);
  bVar3 = ON_LengthValue::IsUnset(&left_side);
  if (bVar3 || (left_side_string_end < string || (long)left_side_string_end - (long)string == 0)) {
    ON_ScaleValue(__return_storage_ptr__,&Unset);
    goto LAB_005ca722;
  }
  if (string_count == -1) {
    iVar6 = -1;
  }
  else {
    iVar6 = string_count - (int)((ulong)((long)left_side_string_end - (long)string) >> 2);
    if (iVar6 < 0) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_string_values.cpp"
                 ,0x4cd,"","Invalid input parameters.");
      ON_ScaleValue(__return_storage_ptr__,&Unset);
      goto LAB_005ca722;
    }
  }
  local_148 = left_side.m_length;
  LVar4 = ON_UnitSystem::UnitSystem(&left_side.m_length_unit_system);
  pwVar2 = left_side_string_end;
  for (uVar7 = 0; (long)uVar7 < (long)iVar6 || iVar6 == -1; uVar7 = uVar7 + 1) {
    bVar3 = ON_ParseSettings::IsInteriorWhiteSpace(&parse_settings,pwVar2[uVar7]);
    if (!bVar3) {
      wVar1 = pwVar2[uVar7];
      if (wVar1 == L'/') {
        local_15a = FractionFormat;
        goto LAB_005ca4d8;
      }
      if (wVar1 == L':') {
        local_15a = RatioFormat;
        goto LAB_005ca4d8;
      }
      if (wVar1 != L'=') {
        local_15a = Unset;
        goto LAB_005ca515;
      }
      local_15a = EquationFormat;
      goto LAB_005ca4d8;
    }
  }
  local_15a = Unset;
  string_00 = pwVar2;
LAB_005ca531:
  iVar5 = (int)((ulong)((long)string_00 - (long)pwVar2) >> 2);
  string_count_00 = iVar6 - iVar5;
  if (string_count_00 == 0 || iVar6 < iVar5) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_string_values.cpp"
               ,0x4ff,"","Invalid input parameters.");
    ON_ScaleValue(__return_storage_ptr__,&Unset);
    goto LAB_005ca722;
  }
  goto LAB_005ca543;
  while (bVar3 = ON_ParseSettings::IsInteriorWhiteSpace(&parse_settings,pwVar2[uVar7]), bVar3) {
LAB_005ca4d8:
    uVar7 = uVar7 + 1;
    if ((iVar6 != -1) && (iVar6 <= (int)uVar7)) {
      string_00 = pwVar2 + (uVar7 & 0xffffffff);
      goto LAB_005ca531;
    }
  }
LAB_005ca515:
  string_00 = pwVar2 + (int)uVar7;
  if (iVar6 != -1) goto LAB_005ca531;
  string_count_00 = -1;
LAB_005ca543:
  right_side_string_end = string_00;
  ON_LengthValue::ON_LengthValue(&right_side);
  if (local_15a == Unset) {
    if (LVar4 == None) {
      ON_LengthValue::Create((ON_LengthValue *)&scale_value,1.0,None,0,ExactDecimal);
      ON_LengthValue::operator=(&right_side,(ON_LengthValue *)&scale_value);
      ON_LengthValue::~ON_LengthValue((ON_LengthValue *)&scale_value);
      dVar8 = floor(local_148);
      local_15a = EquationFormat - (local_148 == dVar8);
      goto LAB_005ca5d2;
    }
LAB_005ca6c7:
    ON_ScaleValue(__return_storage_ptr__,&Unset);
  }
  else {
    right_side_parse_settings.m_reserved_bits = parse_settings.m_reserved_bits;
    right_side_parse_settings.m_context_locale_id = parse_settings.m_context_locale_id;
    right_side_parse_settings.m_context_angle_unit_system =
         parse_settings.m_context_angle_unit_system;
    right_side_parse_settings.m_context_length_unit_system =
         parse_settings.m_context_length_unit_system;
    right_side_parse_settings.m_reserved = parse_settings.m_reserved;
    right_side_parse_settings.m_true_default_bits[0] = parse_settings.m_true_default_bits[0];
    right_side_parse_settings.m_true_default_bits[1] = parse_settings.m_true_default_bits[1];
    right_side_parse_settings.m_false_default_bits[0] = parse_settings.m_false_default_bits[0];
    right_side_parse_settings.m_false_default_bits[1] = parse_settings.m_false_default_bits[1];
    ON_ParseSettings::SetParseLeadingWhiteSpace(&right_side_parse_settings,false);
    parse_settings_00.m_false_default_bits[0] = right_side_parse_settings.m_false_default_bits[0];
    parse_settings_00.m_false_default_bits[1] = right_side_parse_settings.m_false_default_bits[1];
    parse_settings_00.m_true_default_bits[0] = right_side_parse_settings.m_true_default_bits[0];
    parse_settings_00.m_true_default_bits[1] = right_side_parse_settings.m_true_default_bits[1];
    parse_settings_00.m_reserved_bits = right_side_parse_settings.m_reserved_bits;
    parse_settings_00.m_context_locale_id = right_side_parse_settings.m_context_locale_id;
    parse_settings_00.m_context_angle_unit_system =
         right_side_parse_settings.m_context_angle_unit_system;
    parse_settings_00.m_context_length_unit_system =
         right_side_parse_settings.m_context_length_unit_system;
    parse_settings_00.m_reserved = right_side_parse_settings.m_reserved;
    ON_LengthValue::CreateFromSubString
              ((ON_LengthValue *)&scale_value,parse_settings_00,string_00,string_count_00,
               &right_side_string_end);
    ON_LengthValue::operator=(&right_side,(ON_LengthValue *)&scale_value);
    ON_LengthValue::~ON_LengthValue((ON_LengthValue *)&scale_value);
LAB_005ca5d2:
    bVar3 = ON_LengthValue::IsUnset(&right_side);
    if (bVar3) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_string_values.cpp"
                 ,0x51e,"","Invalid input parameters.");
      goto LAB_005ca6c7;
    }
    Create(&scale_value,&left_side,&right_side,local_15a);
    this = &scale_value;
    bVar3 = IsUnset(this);
    if ((bVar3) ||
       (right_side_string_end < string || (long)right_side_string_end - (long)string == 0)) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_string_values.cpp"
                 ,0x52a,"","Invalid input parameters.");
      this = &Unset;
    }
    else {
      ON_wString::ON_wString
                ((ON_wString *)&right_side_parse_settings,string,
                 (int)((ulong)((long)right_side_string_end - (long)string) >> 2));
      ON_wString::operator=(&scale_value.m_scale_as_string,(ON_wString *)&right_side_parse_settings)
      ;
      ON_wString::~ON_wString((ON_wString *)&right_side_parse_settings);
      ON_wString::TrimLeftAndRight(&scale_value.m_scale_as_string,(wchar_t *)0x0);
      if (string_end != (wchar_t **)0x0) {
        *string_end = right_side_string_end;
      }
    }
    ON_ScaleValue(__return_storage_ptr__,this);
    ~ON_ScaleValue(&scale_value);
  }
  ON_LengthValue::~ON_LengthValue(&right_side);
LAB_005ca722:
  ON_LengthValue::~ON_LengthValue(&left_side);
  return __return_storage_ptr__;
}

Assistant:

ON_ScaleValue ON_ScaleValue::CreateFromSubString(
  ON_ParseSettings parse_settings,
  const wchar_t* string,
  int string_count,
  const wchar_t** string_end
)
{
  // All calls to some version of ON_AngleValue::CreateFrom*String(...) end up here.
  if (nullptr != string_end && &string != string_end)
    *string_end = string;

  if (string_count < -1)
  {
    ON_ERROR("Invalid string_count parameter.");
    return ON_ScaleValue::Unset;
  }

  if (nullptr == string || 0 == string_count || 0 == string[0] )
  {
    // empty string fails silently.
    return ON_ScaleValue::Unset;
  }

  const wchar_t* left_side_string_end = nullptr;
  ON_ParseSettings left_side_parse_settings = parse_settings;

  const ON_LengthValue left_side = ON_LengthValue::CreateFromSubString( left_side_parse_settings, string, string_count, &left_side_string_end);

  if (left_side.IsUnset() || nullptr == left_side_string_end || !(string < left_side_string_end))
    return ON_ScaleValue::Unset;

  const size_t left_side_count = left_side_string_end - string;
  if ( -1 != string_count )
  {
    string_count -= (int)left_side_count;
    // 0 = string_count may be ok - conditions checked later.
    if (string_count < 0)
    {
      ON_ERROR("Invalid input parameters.");
      return ON_ScaleValue::Unset;
    }
  }

  const double left_side_length = left_side.Length(ON::LengthUnitSystem::None);
  const ON::LengthUnitSystem left_side_unit_system = left_side.LengthUnitSystem().UnitSystem();

  // look for equal, colon or fraction;
  ON_ScaleValue::ScaleStringFormat format_preference = ON_ScaleValue::ScaleStringFormat::Unset;
  const wchar_t* separator_string = left_side_string_end;
  const wchar_t* separator_string_end = separator_string;
  for (int i = 0; -1 == string_count || i < string_count; i++)
  {
    if (parse_settings.IsInteriorWhiteSpace(separator_string[i]))
      continue;

    switch (separator_string[i])
    {
    case ':':
      format_preference = ON_ScaleValue::ScaleStringFormat::RatioFormat;
      break;

    case '=':
      format_preference = ON_ScaleValue::ScaleStringFormat::EquationFormat;
      break;

    case '/':
      format_preference = ON_ScaleValue::ScaleStringFormat::FractionFormat;
      break;
    }

    if (ON_ScaleValue::ScaleStringFormat::Unset != format_preference)
    {
      for (i++; -1 == string_count || i < string_count; i++)
      {
        if (false == parse_settings.IsInteriorWhiteSpace(separator_string[i]))
          break;
      }
    }
    separator_string_end = separator_string + i;
    break;
  }

  const size_t separator_count = separator_string_end - separator_string;
  if ( -1 != string_count )
  {
    string_count -= (int)separator_count;
    if (string_count <= 0)
    {
      ON_ERROR("Invalid input parameters.");
      return ON_ScaleValue::Unset;
    }
  }

  const wchar_t* right_side_string = separator_string_end;
  const wchar_t* right_side_string_end = right_side_string;
  ON_LengthValue right_side;

  if (ON_ScaleValue::ScaleStringFormat::Unset == format_preference)
  {
    // A single value scanned.
    if (ON::LengthUnitSystem::None != left_side_unit_system)
      return ON_ScaleValue::Unset;
    right_side = ON_LengthValue::Create(1.0, ON::LengthUnitSystem::None, 0, ON_LengthValue::StringFormat::ExactDecimal);

    format_preference
      = (left_side_length == floor(left_side_length) && ON::LengthUnitSystem::None == left_side_unit_system)
        ? ON_ScaleValue::ScaleStringFormat::RatioFormat
        : ON_ScaleValue::ScaleStringFormat::EquationFormat;
  }
  else
  {
    // parse right side
    ON_ParseSettings right_side_parse_settings = parse_settings;
    right_side_parse_settings.SetParseLeadingWhiteSpace(false);
    right_side = ON_LengthValue::CreateFromSubString( right_side_parse_settings, right_side_string, string_count, &right_side_string_end );
  }

  if (right_side.IsUnset())
  {
    ON_ERROR("Invalid input parameters.");
    return ON_ScaleValue::Unset;
  }

  ON_ScaleValue scale_value = ON_ScaleValue::Create(
    left_side,
    right_side,
    format_preference
  );

  if (scale_value.IsUnset() || !(right_side_string_end > string))
  {
    ON_ERROR("Invalid input parameters.");
    return ON_ScaleValue::Unset;
  }

  scale_value.m_scale_as_string = ON_wString(string, (int)(right_side_string_end - string));
  scale_value.m_scale_as_string.TrimLeftAndRight();

  if (nullptr != string_end)
    *string_end = right_side_string_end;

  return scale_value;
}